

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_475b18::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  TransformSelectorRegex *this_local;
  
  (this->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_00ac6158;
  cmsys::RegularExpression::~RegularExpression(&this->Regex);
  TransformSelector::~TransformSelector(&this->super_TransformSelector);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }